

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O2

void __thiscall TPZStructMatrixOT<double>::InitCreateAssemble(TPZStructMatrixOT<double> *this)

{
  InitCreateAssemble((TPZStructMatrixOT<double> *)
                     (&this->field_0x0 + *(long *)(*(long *)this + -0x78)));
  return;
}

Assistant:

void TPZStructMatrixOT<TVar>::InitCreateAssemble()
{
    auto *myself = dynamic_cast<TPZStructMatrix*>(this);
    stat_ass_graph_ot.start();
    TPZManVector<int64_t> ElementOrder;
    TPZStructMatrixOT<TVar>::OrderElement(myself->Mesh(), ElementOrder);
    TPZVec<int64_t> elcolors;
    TPZStructMatrixOT<TVar>::ElementColoring(myself->Mesh(), ElementOrder, fElSequenceColor, fElBlocked, elcolors);
    stat_ass_graph_ot.stop();
}